

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O0

void png_do_bgr(png_row_infop row_info,png_bytep row)

{
  png_byte pVar1;
  uint uVar2;
  uint local_5c;
  png_byte save_3;
  png_bytep ppStack_58;
  png_uint_32 i_3;
  png_bytep rp_3;
  png_byte save_2;
  png_bytep ppStack_48;
  png_uint_32 i_2;
  png_bytep rp_2;
  png_byte save_1;
  png_bytep ppStack_38;
  png_uint_32 i_1;
  png_bytep rp_1;
  png_byte save;
  png_bytep ppStack_28;
  png_uint_32 i;
  png_bytep rp;
  png_uint_32 row_width;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  if ((row_info->color_type & 2) != 0) {
    uVar2 = row_info->width;
    if (row_info->bit_depth == '\b') {
      if (row_info->color_type == '\x02') {
        ppStack_28 = row;
        for (rp_1._4_4_ = 0; rp_1._4_4_ < uVar2; rp_1._4_4_ = rp_1._4_4_ + 1) {
          pVar1 = *ppStack_28;
          *ppStack_28 = ppStack_28[2];
          ppStack_28[2] = pVar1;
          ppStack_28 = ppStack_28 + 3;
        }
      }
      else if (row_info->color_type == '\x06') {
        ppStack_38 = row;
        for (rp_2._4_4_ = 0; rp_2._4_4_ < uVar2; rp_2._4_4_ = rp_2._4_4_ + 1) {
          pVar1 = *ppStack_38;
          *ppStack_38 = ppStack_38[2];
          ppStack_38[2] = pVar1;
          ppStack_38 = ppStack_38 + 4;
        }
      }
    }
    else if (row_info->bit_depth == '\x10') {
      if (row_info->color_type == '\x02') {
        ppStack_48 = row;
        for (rp_3._4_4_ = 0; rp_3._4_4_ < uVar2; rp_3._4_4_ = rp_3._4_4_ + 1) {
          pVar1 = *ppStack_48;
          *ppStack_48 = ppStack_48[4];
          ppStack_48[4] = pVar1;
          pVar1 = ppStack_48[1];
          ppStack_48[1] = ppStack_48[5];
          ppStack_48[5] = pVar1;
          ppStack_48 = ppStack_48 + 6;
        }
      }
      else if (row_info->color_type == '\x06') {
        ppStack_58 = row;
        for (local_5c = 0; local_5c < uVar2; local_5c = local_5c + 1) {
          pVar1 = *ppStack_58;
          *ppStack_58 = ppStack_58[4];
          ppStack_58[4] = pVar1;
          pVar1 = ppStack_58[1];
          ppStack_58[1] = ppStack_58[5];
          ppStack_58[5] = pVar1;
          ppStack_58 = ppStack_58 + 8;
        }
      }
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_bgr(png_row_infop row_info, png_bytep row)
{
   png_debug(1, "in png_do_bgr");

   if ((row_info->color_type & PNG_COLOR_MASK_COLOR) != 0)
   {
      png_uint_32 row_width = row_info->width;
      if (row_info->bit_depth == 8)
      {
         if (row_info->color_type == PNG_COLOR_TYPE_RGB)
         {
            png_bytep rp;
            png_uint_32 i;

            for (i = 0, rp = row; i < row_width; i++, rp += 3)
            {
               png_byte save = *rp;
               *rp = *(rp + 2);
               *(rp + 2) = save;
            }
         }

         else if (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA)
         {
            png_bytep rp;
            png_uint_32 i;

            for (i = 0, rp = row; i < row_width; i++, rp += 4)
            {
               png_byte save = *rp;
               *rp = *(rp + 2);
               *(rp + 2) = save;
            }
         }
      }

#ifdef PNG_16BIT_SUPPORTED
      else if (row_info->bit_depth == 16)
      {
         if (row_info->color_type == PNG_COLOR_TYPE_RGB)
         {
            png_bytep rp;
            png_uint_32 i;

            for (i = 0, rp = row; i < row_width; i++, rp += 6)
            {
               png_byte save = *rp;
               *rp = *(rp + 4);
               *(rp + 4) = save;
               save = *(rp + 1);
               *(rp + 1) = *(rp + 5);
               *(rp + 5) = save;
            }
         }

         else if (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA)
         {
            png_bytep rp;
            png_uint_32 i;

            for (i = 0, rp = row; i < row_width; i++, rp += 8)
            {
               png_byte save = *rp;
               *rp = *(rp + 4);
               *(rp + 4) = save;
               save = *(rp + 1);
               *(rp + 1) = *(rp + 5);
               *(rp + 5) = save;
            }
         }
      }
#endif
   }
}